

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImRect __thiscall ImGuiWindow::TitleBarRect(ImGuiWindow *this)

{
  float fVar1;
  ImGuiContext *g;
  float fVar2;
  ImRect IVar3;
  
  fVar2 = 0.0;
  if ((this->Flags & 1) == 0) {
    fVar2 = GImGui->FontBaseSize * this->FontWindowScale;
    if (this->ParentWindow != (ImGuiWindow *)0x0) {
      fVar2 = fVar2 * this->ParentWindow->FontWindowScale;
    }
    fVar1 = (GImGui->Style).FramePadding.y;
    fVar2 = fVar1 + fVar1 + fVar2;
  }
  IVar3.Max.x = (this->Pos).x + (this->SizeFull).x;
  IVar3.Max.y = (this->Pos).y + fVar2;
  IVar3.Min = this->Pos;
  return IVar3;
}

Assistant:

ImRect      TitleBarRect() const        { return ImRect(Pos, ImVec2(Pos.x + SizeFull.x, Pos.y + TitleBarHeight())); }